

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

QModelIndex * __thiscall
QFileSystemModel::parent
          (QModelIndex *__return_storage_ptr__,QFileSystemModel *this,QModelIndex *index)

{
  int iVar1;
  long lVar2;
  QAbstractItemModel *pQVar3;
  long lVar4;
  uint uVar5;
  Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *pNVar6;
  QString *pQVar7;
  QStringView QVar8;
  
  if ((-1 < index->r) && (-1 < index->c)) {
    lVar2 = *(long *)&this->field_0x8;
    pQVar3 = (index->m).ptr;
    if (pQVar3 == *(QAbstractItemModel **)(lVar2 + 8)) {
      pQVar7 = (QString *)(lVar2 + 0x138);
      if (pQVar3 != (QAbstractItemModel *)0x0) {
        pQVar7 = (QString *)index->i;
      }
      pQVar7 = (QString *)pQVar7[2].d.size;
      if (pQVar7 != (QString *)(lVar2 + 0x138) && pQVar7 != (QString *)0x0) {
        lVar4 = pQVar7[2].d.size;
        pNVar6 = QHashPrivate::
                 Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::
                 findNode<QString>(*(Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>
                                     **)(lVar4 + 0x18),pQVar7);
        QVar8.m_data = (pNVar6->value->fileName).d.ptr;
        QVar8.m_size = (pNVar6->value->fileName).d.size;
        uVar5 = QtPrivate::QStringList_indexOf
                          ((QList_conflict *)(lVar4 + 0x20),QVar8,0,CaseSensitive);
        if (*(int *)(lVar2 + 0x1ac) != 0) {
          iVar1 = *(int *)(lVar4 + 0x48);
          if (iVar1 == -1) {
            uVar5 = ~uVar5 + *(int *)(lVar4 + 0x30);
          }
          else if ((int)uVar5 < iVar1) {
            uVar5 = iVar1 + ~uVar5;
          }
        }
        if (uVar5 != 0xffffffff) {
          __return_storage_ptr__->r = uVar5;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->i = (quintptr)pQVar7;
          (__return_storage_ptr__->m).ptr = &this->super_QAbstractItemModel;
          return __return_storage_ptr__;
        }
        __return_storage_ptr__->r = -1;
        __return_storage_ptr__->c = -1;
        __return_storage_ptr__->i = 0;
        (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
        return __return_storage_ptr__;
      }
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QFileSystemModel::parent(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    if (!d->indexValid(index))
        return QModelIndex();

    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(index);
    Q_ASSERT(indexNode != nullptr);
    QFileSystemModelPrivate::QFileSystemNode *parentNode = indexNode->parent;
    if (parentNode == nullptr || parentNode == &d->root)
        return QModelIndex();

    // get the parent's row
    QFileSystemModelPrivate::QFileSystemNode *grandParentNode = parentNode->parent;
    Q_ASSERT(grandParentNode->children.contains(parentNode->fileName));
    int visualRow = d->translateVisibleLocation(grandParentNode, grandParentNode->visibleLocation(grandParentNode->children.value(parentNode->fileName)->fileName));
    if (visualRow == -1)
        return QModelIndex();
    return createIndex(visualRow, 0, parentNode);
}